

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

void __thiscall PolymerWrapper::PolymerWrapper(PolymerWrapper *this,Ptr *polymer)

{
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Reaction).old_prop_ = 0.0;
  (this->super_Reaction).remove_ = false;
  (this->super_Reaction).tRNA_reaction_ = false;
  (this->super_Reaction)._vptr_Reaction = (_func_int **)&PTR_CalculatePropensity_0019dc78;
  std::__shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->polymer_).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>,
             &polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>);
  (this->super_Reaction).old_prop_ = 0.0;
  (**((this->polymer_).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Polymer)();
  return;
}

Assistant:

PolymerWrapper::PolymerWrapper(Polymer::Ptr polymer) : polymer_(polymer) {
  old_prop_ = 0;
  polymer_->Initialize();
}